

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_add(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mp_int *b_00;
  
  iVar2 = a->sign;
  iVar1 = b->sign;
  if (iVar2 == iVar1) {
    c->sign = iVar2;
    iVar2 = s_mp_add(a,b,c);
    return iVar2;
  }
  iVar3 = mp_cmp_mag(a,b);
  if (iVar3 == -1) {
    c->sign = iVar1;
    b_00 = a;
    a = b;
  }
  else {
    c->sign = iVar2;
    b_00 = b;
  }
  iVar2 = s_mp_sub(a,b_00,c);
  return iVar2;
}

Assistant:

int mp_add (mp_int * a, mp_int * b, mp_int * c)
{
  int     sa, sb, res;

  /* get sign of both inputs */
  sa = a->sign;
  sb = b->sign;

  /* handle two cases, not four */
  if (sa == sb) {
    /* both positive or both negative */
    /* add their magnitudes, copy the sign */
    c->sign = sa;
    res = s_mp_add (a, b, c);
  } else {
    /* one positive, the other negative */
    /* subtract the one with the greater magnitude from */
    /* the one of the lesser magnitude.  The result gets */
    /* the sign of the one with the greater magnitude. */
    if (mp_cmp_mag (a, b) == MP_LT) {
      c->sign = sb;
      res = s_mp_sub (b, a, c);
    } else {
      c->sign = sa;
      res = s_mp_sub (a, b, c);
    }
  }
  return res;
}